

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::CMP(CPU *this,uint8_t reg,uint8_t argument)

{
  uint uVar1;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  
  uVar1 = CONCAT31(in_register_00000031,reg) - CONCAT31(in_register_00000011,argument);
  this->field_0x2e =
       (reg == argument) << 6 |
       (byte)uVar1 >> 7 | ((uVar1 & 0xff00) == 0) << 7 | this->field_0x2e & 0x3e;
  return;
}

Assistant:

void CPU::CMP(uint8_t reg, uint8_t argument) { // CMP, CPY, CPX
	uint16_t result = uint16_t(reg) - argument;
	if (result < 0x100) {
		C = 1;
	} else {
		C = 0;
	}
	if (result & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
	if (reg == argument) {
		Z = 1;
	} else {
		Z = 0;
	}
}